

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicStdLayoutBase2CS::Run(BasicStdLayoutBase2CS *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  size_type sVar6;
  reference pvVar7;
  void *pvVar8;
  byte *pbVar9;
  pointer *local_300;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_278;
  ulong local_270;
  size_t i_1;
  GLubyte *out_data_1;
  int j;
  bool status;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_data;
  undefined1 local_238 [4];
  GLuint i;
  undefined4 local_214;
  int local_210 [2];
  GLint blocksCS;
  stringstream local_200 [8];
  stringstream ss;
  ostream local_1f0;
  undefined1 local_78 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_data [4];
  BasicStdLayoutBase2CS *this_local;
  
  local_278 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78;
  in_data[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  do {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_278);
    local_278 = local_278 + 1;
  } while (local_278 !=
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           &in_data[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::stringstream::stringstream(local_200);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90db,local_210);
  if (local_210[0] < 8) {
    this_local = (BasicStdLayoutBase2CS *)0x0;
  }
  else {
    poVar5 = std::operator<<(&local_1f0,"layout(local_size_x = 1) in;\n");
    iVar3 = (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              _vptr_GLWrapper[9])(this,local_78);
    std::operator<<(poVar5,(char *)CONCAT44(extraout_var,iVar3));
    std::__cxx11::stringstream::str();
    GVar4 = ShaderStorageBufferObjectBase::CreateProgramCS
                      (&this->super_ShaderStorageBufferObjectBase,(string *)local_238);
    this->m_program = GVar4;
    std::__cxx11::string::~string((string *)local_238);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar2) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,8,this->m_buffer);
      for (out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < 4;
          out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        glu::CallLogWrapper::glBindBufferBase
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,
                   out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                   this->m_buffer
                   [out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_]);
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &in_data[(ulong)out_data.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                                    - 1].
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &in_data[(ulong)out_data.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                                     - 1].
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,0);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,sVar6,pvVar7,0x88e4);
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &in_data[(ulong)out_data.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                                    - 1].
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::allocator<unsigned_char>::allocator
                  ((allocator<unsigned_char> *)((long)&out_data_1 + 7));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j,sVar6,
                   (allocator<unsigned_char> *)((long)&out_data_1 + 7));
        std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)((long)&out_data_1 + 7));
        glu::CallLogWrapper::glBindBufferBase
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,
                   out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 4,
                   this->m_buffer
                   [out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 4]);
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &in_data[(ulong)out_data.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                                    - 1].
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j,0);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,sVar6,pvVar7,0x88e4);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j);
      }
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program);
      glu::CallLogWrapper::glDispatchCompute
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,1,1);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      out_data_1._6_1_ = 1;
      for (out_data_1._0_4_ = 0; (int)out_data_1 < 4; out_data_1._0_4_ = (int)out_data_1 + 1) {
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,this->m_buffer[(int)out_data_1 + 4]);
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &in_data[(long)(int)out_data_1 + -1].
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar8 = glu::CallLogWrapper::glMapBufferRange
                           (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                             super_GLWrapper.super_CallLogWrapper,0x90d2,0,sVar6,1);
        if (pvVar8 == (void *)0x0) {
          this_local = (BasicStdLayoutBase2CS *)&DAT_ffffffffffffffff;
          goto LAB_00ff455e;
        }
        local_270 = 0;
        while( true ) {
          sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &in_data[(long)(int)out_data_1 + -1].
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (sVar6 <= local_270) break;
          pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &in_data[(long)(int)out_data_1 + -1].
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,local_270);
          if (*pvVar7 != *(value_type *)((long)pvVar8 + local_270)) {
            bVar1 = *(byte *)((long)pvVar8 + local_270);
            pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &in_data[(long)(int)out_data_1 + -1].
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,local_270);
            anon_unknown_0::Output
                      ("Byte at index %3d is %2x should be %2x.\n",local_270 & 0xffffffff,
                       (ulong)bVar1,(ulong)*pbVar9);
            out_data_1._6_1_ = 0;
          }
          local_270 = local_270 + 1;
        }
        glu::CallLogWrapper::glUnmapBuffer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2);
      }
      if ((out_data_1._6_1_ & 1) == 0) {
        this_local = (BasicStdLayoutBase2CS *)&DAT_ffffffffffffffff;
      }
      else {
        this_local = (BasicStdLayoutBase2CS *)0x0;
      }
    }
    else {
      this_local = (BasicStdLayoutBase2CS *)&DAT_ffffffffffffffff;
    }
  }
LAB_00ff455e:
  local_214 = 1;
  std::__cxx11::stringstream::~stringstream(local_200);
  local_300 = &in_data[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  do {
    local_300 = local_300 + -3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_300);
  } while (local_300 != (pointer *)local_78);
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		std::vector<GLubyte> in_data[4];
		std::stringstream	ss;
		GLint				 blocksCS;
		glGetIntegerv(GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS, &blocksCS);
		if (blocksCS < 8)
			return NO_ERROR;
		ss << "layout(local_size_x = 1) in;\n" << GetInput(in_data);
		m_program = CreateProgramCS(ss.str());
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(8, m_buffer);

		for (GLuint i = 0; i < 4; ++i)
		{
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[i].size(), &in_data[i][0], GL_STATIC_DRAW);

			std::vector<GLubyte> out_data(in_data[i].size());
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i + 4, m_buffer[i + 4]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[i].size(), &out_data[0], GL_STATIC_DRAW);
		}

		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		bool status = true;
		for (int j = 0; j < 4; ++j)
		{
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[j + 4]);
			GLubyte* out_data =
				(GLubyte*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)in_data[j].size(), GL_MAP_READ_BIT);
			if (!out_data)
				return ERROR;

			for (size_t i = 0; i < in_data[j].size(); ++i)
			{
				if (in_data[j][i] != out_data[i])
				{
					Output("Byte at index %3d is %2x should be %2x.\n", static_cast<int>(i), out_data[i],
						   in_data[j][i]);
					status = false;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		if (!status)
			return ERROR;
		return NO_ERROR;
	}